

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase148::run(TestCase148 *this)

{
  EventLoop *this_00;
  void **this_01;
  CapTableBuilder *pCVar1;
  RequestHook *pRVar2;
  long *plVar3;
  CapTableReader *pCVar4;
  ClientHook *pCVar5;
  WirePointer *pWVar6;
  undefined8 uVar7;
  Disposer *pDVar8;
  int iVar9;
  CapTableBuilder *pCVar10;
  char *pcVar11;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar12;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  bool bVar13;
  Own<capnp::ClientHook> OVar14;
  int callerCallCount;
  WaitScope waitScope;
  Response<capnproto_test::capnp::test::TestTailCallee::TailResult> response;
  int calleeCallCount;
  Client callee;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall2;
  Client caller;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall1;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall0;
  RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult> promise;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  request;
  EventLoop loop;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_2f0;
  long *local_2b8;
  int local_2ac;
  EventLoop *local_2a8;
  undefined4 local_2a0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_298;
  long *local_260;
  int local_254;
  undefined1 local_250 [16];
  CapTableReader *pCStack_240;
  pointer_____offset_0x10___ *local_238;
  Client local_230;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_220;
  undefined1 local_1e8 [8];
  Client local_1e0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_1d0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_198;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  local_160;
  SegmentBuilder *local_128;
  CapTableBuilder *local_120;
  WirePointer *local_118;
  undefined4 local_110;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  local_108;
  undefined1 local_d0 [72];
  Maybe<capnp::MessageSize> local_88;
  Maybe<capnp::MessageSize> local_70;
  Maybe<capnp::MessageSize> local_58;
  Maybe<capnp::MessageSize> local_40;
  
  this_00 = (EventLoop *)(local_d0 + 0x10);
  kj::EventLoop::EventLoop(this_00);
  local_2a0 = 0xffffffff;
  local_2a8 = this_00;
  kj::EventLoop::enterScope(this_00);
  local_254 = 0;
  local_2ac = 0;
  kj::heap<capnp::_::TestTailCalleeImpl,int&>((kj *)&local_2f0,&local_254);
  local_298.super_Builder._builder.segment =
       (SegmentBuilder *)
       CONCAT44(local_2f0.super_Builder._builder.segment._4_4_,
                local_2f0.super_Builder._builder.segment._0_4_);
  local_298.super_Builder._builder.capTable = local_2f0.super_Builder._builder.capTable + 2;
  if (local_2f0.super_Builder._builder.capTable == (CapTableBuilder *)0x0) {
    local_298.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  }
  local_2f0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  OVar14 = Capability::Client::makeLocalClient
                     (&local_230,(Own<capnp::Capability::Server> *)&local_298);
  pCVar10 = local_298.super_Builder._builder.capTable;
  if (local_298.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_298.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_298.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_298.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar10->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar10->super_CapTableReader)._vptr_CapTableReader[-2]),OVar14.ptr);
  }
  pCVar10 = local_2f0.super_Builder._builder.capTable;
  local_238 = &capnproto_test::capnp::test::TestTailCallee::Client::typeinfo;
  if (local_2f0.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_2f0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_2f0.super_Builder._builder.segment._4_4_,
                         local_2f0.super_Builder._builder.segment._0_4_))
              ((undefined8 *)
               CONCAT44(local_2f0.super_Builder._builder.segment._4_4_,
                        local_2f0.super_Builder._builder.segment._0_4_),
               (_func_int *)
               ((long)&(pCVar10->super_CapTableReader)._vptr_CapTableReader +
               (long)(pCVar10->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  kj::heap<capnp::_::TestTailCallerImpl,int&>((kj *)&local_2f0,&local_2ac);
  pCVar10 = local_2f0.super_Builder._builder.capTable;
  local_298.super_Builder._builder.segment =
       (SegmentBuilder *)
       CONCAT44(local_2f0.super_Builder._builder.segment._4_4_,
                local_2f0.super_Builder._builder.segment._0_4_);
  local_298.super_Builder._builder.capTable = local_2f0.super_Builder._builder.capTable + 2;
  if (local_2f0.super_Builder._builder.capTable == (CapTableBuilder *)0x0) {
    local_298.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  }
  local_2f0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  OVar14 = Capability::Client::makeLocalClient
                     (&local_1e0,(Own<capnp::Capability::Server> *)&local_298);
  pCVar1 = local_298.super_Builder._builder.capTable;
  if (local_298.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_298.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_298.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_298.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar1->super_CapTableReader)._vptr_CapTableReader[-2]),OVar14.ptr);
  }
  pCVar1 = local_2f0.super_Builder._builder.capTable;
  local_1e8 = (undefined1  [8])&capnproto_test::capnp::test::TestTailCaller::Client::typeinfo;
  if (local_2f0.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_2f0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_2f0.super_Builder._builder.segment._4_4_,
                         local_2f0.super_Builder._builder.segment._0_4_))
              ((undefined8 *)
               CONCAT44(local_2f0.super_Builder._builder.segment._4_4_,
                        local_2f0.super_Builder._builder.segment._0_4_),
               (_func_int *)
               ((long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader +
               (long)(pCVar1->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  local_40.ptr.isSet = false;
  capnproto_test::capnp::test::TestTailCaller::Client::fooRequest
            (&local_108,(Client *)local_1e8,&local_40);
  *(undefined4 *)local_108.super_Builder._builder.data = 0x1c8;
  local_298.super_Builder._builder.segment =
       (SegmentBuilder *)
       CONCAT44(local_108.super_Builder._builder.segment._4_4_,
                local_108.super_Builder._builder.segment._0_4_);
  local_298.super_Builder._builder.capTable =
       (CapTableBuilder *)
       CONCAT44(local_108.super_Builder._builder.capTable._4_4_,
                local_108.super_Builder._builder.capTable._0_4_);
  local_298.super_Builder._builder.data = local_108.super_Builder._builder.pointers;
  (**(code **)(**(long **)((long)&local_230.hook.disposer + (long)local_238[-3]) + 0x20))
            (&local_2f0);
  PointerBuilder::setCapability((PointerBuilder *)&local_298,(Own<capnp::ClientHook> *)&local_2f0);
  pCVar1 = local_2f0.super_Builder._builder.capTable;
  pvVar12 = extraout_RDX;
  if (local_2f0.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_2f0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_2f0.super_Builder._builder.segment._4_4_,
                         local_2f0.super_Builder._builder.segment._0_4_))
              ((undefined8 *)
               CONCAT44(local_2f0.super_Builder._builder.segment._4_4_,
                        local_2f0.super_Builder._builder.segment._0_4_),
               (_func_int *)
               ((long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader +
               (long)(pCVar1->super_CapTableReader)._vptr_CapTableReader[-2]));
    pvVar12 = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::send(&local_160,(int)&local_108,pvVar12,(size_t)pCVar10,in_R8D);
  this_01 = &local_160.super_Builder._builder.data;
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            ((Client *)&local_2f0,(Pipeline *)this_01);
  local_58.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_298,(Client *)&local_2f0,&local_58);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_198,(int)&local_298,__buf,(size_t)pCVar10,in_R8D);
  pRVar2 = local_298.hook.ptr;
  if (local_298.hook.ptr != (RequestHook *)0x0) {
    local_298.hook.ptr = (RequestHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_298.hook.disposer._4_4_,(uint)local_298.hook.disposer)
    )((undefined8 *)CONCAT44(local_298.hook.disposer._4_4_,(uint)local_298.hook.disposer),
      (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2]));
  }
  pvVar12 = local_2f0.super_Builder._builder.data;
  if ((long *)local_2f0.super_Builder._builder.data != (long *)0x0) {
    local_2f0.super_Builder._builder.data = (long *)0x0;
    (**((local_2f0.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_2f0.super_Builder._builder.capTable,(long)pvVar12 + *(long *)(*pvVar12 + -0x10)
              );
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_> *)
             &local_298,&local_160);
  pcVar11 = (char *)CONCAT71((int7)((ulong)pCVar10 >> 8),1);
  if (0x1f < local_298.super_Builder._builder.dataSize) {
    pcVar11 = (char *)CONCAT71((int7)((ulong)local_298.super_Builder._builder.data >> 8),
                               ((WireValue<uint32_t>_conflict *)
                               local_298.super_Builder._builder.data)->value != 0x1c8);
  }
  if (((char)pcVar11 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_1d0.super_Builder._builder.segment._0_4_ = 0;
    local_2f0.super_Builder._builder.segment._0_4_ = 0x1c8;
    if (0x1f < local_298.super_Builder._builder.dataSize) {
      local_1d0.super_Builder._builder.segment._0_4_ =
           ((WireValue<uint32_t>_conflict *)local_298.super_Builder._builder.data)->value;
    }
    pcVar11 = "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()";
    in_R8D = 0x4c9ad5;
    kj::_::Debug::log<char_const(&)[44],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xa7,ERROR,
               "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()",
               (char (*) [44])"failed: expected (456) == (response.getI())",(int *)&local_2f0,
               (uint *)&local_1d0);
  }
  pcVar11 = (char *)CONCAT71((int7)((ulong)pcVar11 >> 8),1);
  if (0x1f < local_298.super_Builder._builder.dataSize) {
    pcVar11 = (char *)CONCAT71((int7)((ulong)local_298.super_Builder._builder.data >> 8),
                               ((WireValue<uint32_t>_conflict *)
                               local_298.super_Builder._builder.data)->value != 0x1c8);
  }
  if (((char)pcVar11 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_1d0.super_Builder._builder.segment._0_4_ = 0;
    local_2f0.super_Builder._builder.segment._0_4_ = 0x1c8;
    if (0x1f < local_298.super_Builder._builder.dataSize) {
      local_1d0.super_Builder._builder.segment._0_4_ =
           ((WireValue<uint32_t>_conflict *)local_298.super_Builder._builder.data)->value;
    }
    pcVar11 = "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()";
    in_R8D = 0x4c9ad5;
    kj::_::Debug::log<char_const(&)[44],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xa8,ERROR,
               "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()",
               (char (*) [44])"failed: expected (456) == (response.getI())",(int *)&local_2f0,
               (uint *)&local_1d0);
  }
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            ((Client *)&local_220,(Pipeline *)this_01);
  local_70.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_2f0,(Client *)&local_220,&local_70);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_1d0,(int)&local_2f0,__buf_00,(size_t)pcVar11,in_R8D);
  pRVar2 = local_2f0.hook.ptr;
  if (local_2f0.hook.ptr != (RequestHook *)0x0) {
    local_2f0.hook.ptr = (RequestHook *)0x0;
    (**(local_2f0.hook.disposer)->_vptr_Disposer)
              (local_2f0.hook.disposer,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  pvVar12 = local_220.super_Builder._builder.data;
  if ((long *)local_220.super_Builder._builder.data != (long *)0x0) {
    local_220.super_Builder._builder.data = (long *)0x0;
    (**((local_220.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_220.super_Builder._builder.capTable,(long)pvVar12 + *(long *)(*pvVar12 + -0x10)
              );
  }
  if (local_298.super_Builder._builder.pointerCount < 2) {
    __n = 0x7fffffff;
    local_298.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    local_118 = (WirePointer *)0x0;
    local_298.super_Builder._builder.segment = (SegmentBuilder *)0x0;
  }
  else {
    local_118 = local_298.super_Builder._builder.pointers + 1;
    __n = (size_t)(uint)local_298.hook.disposer;
  }
  local_110 = (undefined4)__n;
  local_128 = local_298.super_Builder._builder.segment;
  local_120 = local_298.super_Builder._builder.capTable;
  PointerReader::getCapability((PointerReader *)local_d0);
  local_250._8_8_ = local_d0._0_8_;
  pCStack_240 = (CapTableReader *)local_d0._8_8_;
  local_250._0_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
  local_88.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_2f0,(Client *)local_250,&local_88);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_220,(int)&local_2f0,__buf_01,__n,in_R8D);
  pRVar2 = local_2f0.hook.ptr;
  if (local_2f0.hook.ptr != (RequestHook *)0x0) {
    local_2f0.hook.ptr = (RequestHook *)0x0;
    (**(local_2f0.hook.disposer)->_vptr_Disposer)
              (local_2f0.hook.disposer,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  pCVar4 = pCStack_240;
  if (pCStack_240 != (CapTableReader *)0x0) {
    pCStack_240 = (CapTableReader *)0x0;
    (*(code *)(*(Arena **)local_250._8_8_)->_vptr_Arena)
              (local_250._8_8_,
               (_func_int *)
               ((long)&pCVar4->_vptr_CapTableReader + (long)pCVar4->_vptr_CapTableReader[-2]));
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_2f0,&local_198);
  plVar3 = local_2b8;
  if (local_2f0.super_Builder._builder.dataSize < 0x20) {
    bVar13 = false;
  }
  else {
    bVar13 = *local_2f0.super_Builder._builder.data != 0;
  }
  if (local_2b8 != (long *)0x0) {
    local_2b8 = (long *)0x0;
    (**(local_2f0.hook.ptr)->_vptr_RequestHook)
              (local_2f0.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if ((bool)(bVar13 & kj::_::Debug::minSeverity < 3)) {
    local_128 = (SegmentBuilder *)((ulong)local_128 & 0xffffffff00000000);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_2f0,&local_198);
    iVar9 = 0;
    if (0x1f < local_2f0.super_Builder._builder.dataSize) {
      iVar9 = *local_2f0.super_Builder._builder.data;
    }
    local_250._0_4_ = iVar9;
    kj::_::Debug::log<char_const(&)[64],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xae,ERROR,
               "\"failed: expected \" \"(0) == (dependentCall0.wait(waitScope).getN())\", 0, dependentCall0.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (0) == (dependentCall0.wait(waitScope).getN())",
               (int *)&local_128,(uint *)local_250);
    plVar3 = local_2b8;
    if (local_2b8 != (long *)0x0) {
      local_2b8 = (long *)0x0;
      (**(local_2f0.hook.ptr)->_vptr_RequestHook)
                (local_2f0.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_2f0,&local_1d0);
  plVar3 = local_2b8;
  bVar13 = true;
  if (0x1f < local_2f0.super_Builder._builder.dataSize) {
    bVar13 = *local_2f0.super_Builder._builder.data != 1;
  }
  if (local_2b8 != (long *)0x0) {
    local_2b8 = (long *)0x0;
    (**(local_2f0.hook.ptr)->_vptr_RequestHook)
              (local_2f0.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if ((bool)(bVar13 & kj::_::Debug::minSeverity < 3)) {
    local_128 = (SegmentBuilder *)CONCAT44(local_128._4_4_,1);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_2f0,&local_1d0);
    iVar9 = 0;
    if (0x1f < local_2f0.super_Builder._builder.dataSize) {
      iVar9 = *local_2f0.super_Builder._builder.data;
    }
    local_250._0_4_ = iVar9;
    kj::_::Debug::log<char_const(&)[64],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xaf,ERROR,
               "\"failed: expected \" \"(1) == (dependentCall1.wait(waitScope).getN())\", 1, dependentCall1.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (1) == (dependentCall1.wait(waitScope).getN())",
               (int *)&local_128,(uint *)local_250);
    plVar3 = local_2b8;
    if (local_2b8 != (long *)0x0) {
      local_2b8 = (long *)0x0;
      (**(local_2f0.hook.ptr)->_vptr_RequestHook)
                (local_2f0.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_2f0,&local_220);
  plVar3 = local_2b8;
  bVar13 = true;
  if (0x1f < local_2f0.super_Builder._builder.dataSize) {
    bVar13 = *local_2f0.super_Builder._builder.data != 2;
  }
  if (local_2b8 != (long *)0x0) {
    local_2b8 = (long *)0x0;
    (**(local_2f0.hook.ptr)->_vptr_RequestHook)
              (local_2f0.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if ((bool)(bVar13 & kj::_::Debug::minSeverity < 3)) {
    local_128 = (SegmentBuilder *)CONCAT44(local_128._4_4_,2);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_2f0,&local_220);
    iVar9 = 0;
    if (0x1f < local_2f0.super_Builder._builder.dataSize) {
      iVar9 = *local_2f0.super_Builder._builder.data;
    }
    local_250._0_4_ = iVar9;
    kj::_::Debug::log<char_const(&)[64],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xb0,ERROR,
               "\"failed: expected \" \"(2) == (dependentCall2.wait(waitScope).getN())\", 2, dependentCall2.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (2) == (dependentCall2.wait(waitScope).getN())",
               (int *)&local_128,(uint *)local_250);
    plVar3 = local_2b8;
    if (local_2b8 != (long *)0x0) {
      local_2b8 = (long *)0x0;
      (**(local_2f0.hook.ptr)->_vptr_RequestHook)
                (local_2f0.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  if ((local_254 != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_2f0.super_Builder._builder.segment._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[42],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xb2,ERROR,"\"failed: expected \" \"(1) == (calleeCallCount)\", 1, calleeCallCount",
               (char (*) [42])"failed: expected (1) == (calleeCallCount)",(int *)&local_2f0,
               &local_254);
  }
  if ((local_2ac != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_2f0.super_Builder._builder.segment._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[42],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xb3,ERROR,"\"failed: expected \" \"(1) == (callerCallCount)\", 1, callerCallCount",
               (char (*) [42])"failed: expected (1) == (callerCallCount)",(int *)&local_2f0,
               &local_2ac);
  }
  pDVar8 = local_220.hook.disposer;
  uVar7 = local_220.super_Builder._builder._32_8_;
  if (local_220.super_Builder._builder._32_8_ != 0) {
    local_220.super_Builder._builder.dataSize = 0;
    local_220.super_Builder._builder.pointerCount = 0;
    local_220.super_Builder._builder._38_2_ = 0;
    local_220.hook.disposer = (Disposer *)0x0;
    (**(local_220.hook.ptr)->_vptr_RequestHook)(local_220.hook.ptr,uVar7,8,pDVar8,pDVar8,0);
  }
  pWVar6 = local_220.super_Builder._builder.pointers;
  if (local_220.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_220.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_220.super_Builder._builder.data)
              (local_220.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
  }
  pCVar10 = local_220.super_Builder._builder.capTable;
  if (local_220.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_220.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_220.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_220.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar10->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar10->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pDVar8 = local_1d0.hook.disposer;
  uVar7 = local_1d0.super_Builder._builder._32_8_;
  if (local_1d0.super_Builder._builder._32_8_ != 0) {
    local_1d0.super_Builder._builder.dataSize = 0;
    local_1d0.super_Builder._builder.pointerCount = 0;
    local_1d0.super_Builder._builder._38_2_ = 0;
    local_1d0.hook.disposer = (Disposer *)0x0;
    (**(local_1d0.hook.ptr)->_vptr_RequestHook)(local_1d0.hook.ptr,uVar7,8,pDVar8,pDVar8,0);
  }
  pWVar6 = local_1d0.super_Builder._builder.pointers;
  if (local_1d0.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_1d0.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_1d0.super_Builder._builder.data)
              (local_1d0.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
  }
  pCVar10 = local_1d0.super_Builder._builder.capTable;
  if (local_1d0.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_1d0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_1d0.super_Builder._builder.segment._4_4_,
                         (uint)local_1d0.super_Builder._builder.segment))
              ((undefined8 *)
               CONCAT44(local_1d0.super_Builder._builder.segment._4_4_,
                        (uint)local_1d0.super_Builder._builder.segment),
               (_func_int *)
               ((long)&(pCVar10->super_CapTableReader)._vptr_CapTableReader +
               (long)(pCVar10->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  plVar3 = local_260;
  if (local_260 != (long *)0x0) {
    local_260 = (long *)0x0;
    (**(local_298.hook.ptr)->_vptr_RequestHook)
              (local_298.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  pDVar8 = local_198.hook.disposer;
  uVar7 = local_198.super_Builder._builder._32_8_;
  if (local_198.super_Builder._builder._32_8_ != 0) {
    local_198.super_Builder._builder.dataSize = 0;
    local_198.super_Builder._builder.pointerCount = 0;
    local_198.super_Builder._builder._38_2_ = 0;
    local_198.hook.disposer = (Disposer *)0x0;
    (**(local_198.hook.ptr)->_vptr_RequestHook)(local_198.hook.ptr,uVar7,8,pDVar8,pDVar8,0);
  }
  pWVar6 = local_198.super_Builder._builder.pointers;
  if (local_198.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_198.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_198.super_Builder._builder.data)
              (local_198.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
  }
  pCVar10 = local_198.super_Builder._builder.capTable;
  if (local_198.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_198.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_198.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_198.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar10->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar10->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pDVar8 = local_160.hook.disposer;
  uVar7 = local_160.super_Builder._builder._32_8_;
  if (local_160.super_Builder._builder._32_8_ != 0) {
    local_160.super_Builder._builder.dataSize = 0;
    local_160.super_Builder._builder.pointerCount = 0;
    local_160.super_Builder._builder._38_2_ = 0;
    local_160.hook.disposer = (Disposer *)0x0;
    (**(local_160.hook.ptr)->_vptr_RequestHook)(local_160.hook.ptr,uVar7,8,pDVar8,pDVar8,0);
  }
  pWVar6 = local_160.super_Builder._builder.pointers;
  if (local_160.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_160.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_160.super_Builder._builder.data)
              (local_160.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
  }
  pCVar10 = local_160.super_Builder._builder.capTable;
  if (local_160.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_160.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_160.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_160.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar10->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar10->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pRVar2 = local_108.hook.ptr;
  if (local_108.hook.ptr != (RequestHook *)0x0) {
    local_108.hook.ptr = (RequestHook *)0x0;
    (**(local_108.hook.disposer)->_vptr_Disposer)
              (local_108.hook.disposer,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  pCVar5 = local_1e0.hook.ptr;
  if (local_1e0.hook.ptr != (ClientHook *)0x0) {
    local_1e0.hook.ptr = (ClientHook *)0x0;
    (**(local_1e0.hook.disposer)->_vptr_Disposer)
              (local_1e0.hook.disposer,
               (_func_int *)((long)&pCVar5->_vptr_ClientHook + (long)pCVar5->_vptr_ClientHook[-2]));
  }
  pCVar5 = local_230.hook.ptr;
  if (local_230.hook.ptr != (ClientHook *)0x0) {
    local_230.hook.ptr = (ClientHook *)0x0;
    (**(local_230.hook.disposer)->_vptr_Disposer)
              (local_230.hook.disposer,
               (_func_int *)((long)&pCVar5->_vptr_ClientHook + (long)pCVar5->_vptr_ClientHook[-2]));
  }
  kj::EventLoop::leaveScope(local_2a8);
  kj::EventLoop::~EventLoop((EventLoop *)(local_d0 + 0x10));
  return;
}

Assistant:

TEST(Capability, TailCall) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int calleeCallCount = 0;
  int callerCallCount = 0;

  test::TestTailCallee::Client callee(kj::heap<TestTailCalleeImpl>(calleeCallCount));
  test::TestTailCaller::Client caller(kj::heap<TestTailCallerImpl>(callerCallCount));

  auto request = caller.fooRequest();
  request.setI(456);
  request.setCallee(callee);

  auto promise = request.send();

  auto dependentCall0 = promise.getC().getCallSequenceRequest().send();

  auto response = promise.wait(waitScope);
  EXPECT_EQ(456, response.getI());
  EXPECT_EQ(456, response.getI());

  auto dependentCall1 = promise.getC().getCallSequenceRequest().send();

  auto dependentCall2 = response.getC().getCallSequenceRequest().send();

  EXPECT_EQ(0, dependentCall0.wait(waitScope).getN());
  EXPECT_EQ(1, dependentCall1.wait(waitScope).getN());
  EXPECT_EQ(2, dependentCall2.wait(waitScope).getN());

  EXPECT_EQ(1, calleeCallCount);
  EXPECT_EQ(1, callerCallCount);
}